

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolUDP.cpp
# Opt level: O2

void __thiscall
ProtocolUDP::Transmit
          (ProtocolUDP *this,DataBuffer *buffer,uint8_t *targetIP,uint16_t targetPort,
          uint8_t *sourceIP,uint16_t sourcePort)

{
  uint8_t *puVar1;
  uint16_t value;
  uint32_t uVar2;
  undefined8 in_RAX;
  undefined4 uStack_38;
  uint8_t pheader_tmp [4];
  
  puVar1 = buffer->Packet;
  buffer->Packet = puVar1 + -8;
  buffer->Remainder = buffer->Remainder + 8;
  _uStack_38 = in_RAX;
  Pack16(puVar1 + -8,0,sourcePort);
  Pack16(buffer->Packet,2,targetPort);
  Pack16(buffer->Packet,4,buffer->Length);
  _uStack_38 = CONCAT24(0x1100,uStack_38);
  Pack16(pheader_tmp,2,buffer->Length);
  FCS::ChecksumAdd(sourceIP,4,0);
  uVar2 = FCS::ChecksumAdd(targetIP,4,0);
  uVar2 = FCS::ChecksumAdd(pheader_tmp,4,uVar2);
  uVar2 = FCS::ChecksumAdd(buffer->Packet,(uint)buffer->Length,uVar2);
  puVar1 = buffer->Packet;
  value = FCS::ChecksumComplete(uVar2);
  Pack16(puVar1,6,value);
  ProtocolIPv4::Transmit(this->IP,buffer,'\x11',targetIP,sourceIP);
  return;
}

Assistant:

void ProtocolUDP::Transmit(DataBuffer* buffer,
                           const uint8_t* targetIP,
                           uint16_t targetPort,
                           const uint8_t* sourceIP,
                           uint16_t sourcePort)
{
    buffer->Packet -= header_size();
    buffer->Remainder += header_size();

    Pack16(buffer->Packet, 0, sourcePort);
    Pack16(buffer->Packet, 2, targetPort);
    Pack16(buffer->Packet, 4, buffer->Length);

    // Calculate checksum
    uint8_t pheader_tmp[4];
    pheader_tmp[0] = 0;
    pheader_tmp[1] = 0x11;
    Pack16(pheader_tmp, 2, buffer->Length);
    uint32_t acc = 0;
    FCS::ChecksumAdd(sourceIP, 4, acc);
    acc = FCS::ChecksumAdd(targetIP, 4, acc);
    acc = FCS::ChecksumAdd(pheader_tmp, 4, acc);
    acc = FCS::ChecksumAdd(buffer->Packet, buffer->Length, acc);
    Pack16(buffer->Packet, 6, FCS::ChecksumComplete(acc));

    IP.Transmit(buffer, 0x11, targetIP, sourceIP);
}